

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O0

void ut::
     are_equal<agge::tests::mocks::path::point,2ul,std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>>
               (point (*expected) [2],
               vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
               *actual,LocationInfo *location)

{
  vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  *__first1;
  bool value;
  const_iterator cVar1;
  const_iterator __last;
  point *__last1;
  unsigned_long local_30 [2];
  LocationInfo *local_20;
  LocationInfo *location_local;
  vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  *actual_local;
  point (*expected_local) [2];
  
  local_30[1] = 2;
  local_20 = location;
  location_local = (LocationInfo *)actual;
  actual_local = (vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                  *)expected;
  cVar1 = std::
          vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
          ::begin(actual);
  __last = std::
           vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
           ::end((vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                  *)location_local);
  local_30[0] = std::
                distance<__gnu_cxx::__normal_iterator<agge::tests::mocks::path::point_const*,std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>>>
                          ((__normal_iterator<const_agge::tests::mocks::path::point_*,_std::vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>_>
                            )cVar1._M_current,
                           (__normal_iterator<const_agge::tests::mocks::path::point_*,_std::vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>_>
                            )__last._M_current);
  are_equal<unsigned_long,unsigned_long>(local_30 + 1,local_30,local_20);
  __first1 = actual_local;
  __last1 = (point *)(actual_local + 1);
  cVar1 = std::
          vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
          ::begin((vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                   *)location_local);
  value = std::
          equal<agge::tests::mocks::path::point*,__gnu_cxx::__normal_iterator<agge::tests::mocks::path::point_const*,std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>>>
                    ((point *)__first1,__last1,
                     (__normal_iterator<const_agge::tests::mocks::path::point_*,_std::vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>_>
                      )cVar1._M_current);
  is_true(value,local_20);
  return;
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}